

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_input_any_mouse_click_in_rect(nk_input *in,nk_rect b)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  bVar3 = false;
  do {
    if (in != (nk_input *)0x0 && !bVar3) {
      fVar1 = *(float *)((long)&(in->mouse).buttons[0].clicked_pos.x + lVar2);
      bVar3 = false;
      if ((b.x <= fVar1) && (bVar3 = false, fVar1 < b.w + b.x)) {
        fVar1 = *(float *)((long)&(in->mouse).buttons[0].clicked_pos.y + lVar2);
        bVar3 = false;
        if ((b.y <= fVar1) && (bVar3 = false, fVar1 < b.h + b.y)) {
          if (*(int *)((long)&(in->mouse).buttons[0].down + lVar2) == 0) {
            bVar3 = *(int *)((long)&(in->mouse).buttons[0].clicked + lVar2) != 0;
          }
          else {
            bVar3 = false;
          }
        }
      }
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  return (uint)bVar3;
}

Assistant:

NK_API nk_bool
nk_input_any_mouse_click_in_rect(const struct nk_input *in, struct nk_rect b)
{
int i, down = 0;
for (i = 0; i < NK_BUTTON_MAX; ++i)
down = down || nk_input_is_mouse_click_in_rect(in, (enum nk_buttons)i, b);
return down;
}